

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineIterator.cpp
# Opt level: O2

bool skipIfAtLineEnd(char **P)

{
  char *pcVar1;
  long lVar2;
  
  pcVar1 = *P;
  if (*pcVar1 == '\n') {
    lVar2 = 1;
  }
  else {
    if ((*pcVar1 != '\r') || (pcVar1[1] != '\n')) {
      return false;
    }
    lVar2 = 2;
  }
  *P = pcVar1 + lVar2;
  return true;
}

Assistant:

static bool skipIfAtLineEnd(const char *&P) {
  if (*P == '\n') {
    ++P;
    return true;
  }
  if (*P == '\r' && *(P + 1) == '\n') {
    P += 2;
    return true;
  }
  return false;
}